

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool ON_IsConicEquationAnEllipse
               (double *conic,ON_2dPoint *center,ON_2dVector *major_axis,ON_2dVector *minor_axis,
               double *major_radius,double *minor_radius)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double c;
  double s;
  double alpha;
  double P [2];
  double Y [2];
  double X [2];
  double y0;
  double x0;
  double F;
  double E;
  double D;
  double C;
  double A;
  double *minor_radius_local;
  double *major_radius_local;
  ON_2dVector *minor_axis_local;
  ON_2dVector *major_axis_local;
  ON_2dPoint *center_local;
  double *conic_local;
  
  bVar1 = ON_IsValid(*conic);
  if (((((bVar1) && (bVar1 = ON_IsValid(conic[1]), bVar1)) && (bVar1 = ON_IsValid(conic[2]), bVar1))
      && ((bVar1 = ON_IsValid(conic[3]), bVar1 && (bVar1 = ON_IsValid(conic[4]), bVar1)))) &&
     (bVar1 = ON_IsValid(conic[5]), bVar1)) {
    if (ABS(conic[1]) <= ABS(*conic + ABS(conic[2])) * 1e-14) {
      C = *conic;
      D = conic[2];
      E = conic[3];
      F = conic[4];
      Y[1] = 1.0;
      X[0] = 0.0;
      P[1] = 0.0;
    }
    else {
      dVar2 = atan2(conic[1],*conic - conic[2]);
      X[0] = sin(dVar2 * 0.5);
      Y[1] = cos(dVar2 * 0.5);
      P[1] = -X[0];
      C = conic[2] * X[0] * X[0] + *conic * Y[1] * Y[1] + conic[1] * Y[1] * X[0];
      D = conic[2] * Y[1] * Y[1] + *conic * X[0] * X[0] + -(conic[1] * Y[1] * X[0]);
      E = conic[3] * Y[1] + conic[4] * X[0];
      F = conic[4] * Y[1] + -(conic[3] * X[0]);
    }
    if (((0.0 < C) && (0.0 < D)) || ((C < 0.0 && (D < 0.0)))) {
      dVar2 = (E * -0.5) / C;
      dVar3 = (F * -0.5) / D;
      dVar4 = conic[5] - (C * dVar2 * dVar2 + D * dVar3 * dVar3);
      if ((dVar4 != 0.0) || (NAN(dVar4))) {
        dVar5 = sqrt(-dVar4 / C);
        dVar4 = sqrt(-dVar4 / D);
        if ((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) {
          if (dVar5 <= dVar4) {
            if (dVar4 <= dVar5) {
              return false;
            }
            major_axis->x = P[1];
            major_axis->y = Y[1];
            minor_axis->x = -Y[1];
            minor_axis->y = -X[0];
            *major_radius = dVar4;
            *minor_radius = dVar5;
          }
          else {
            major_axis->x = Y[1];
            major_axis->y = X[0];
            minor_axis->x = P[1];
            minor_axis->y = Y[1];
            *major_radius = dVar5;
            *minor_radius = dVar4;
          }
        }
        else {
          major_axis->x = 1.0;
          major_axis->y = 0.0;
          minor_axis->x = 0.0;
          minor_axis->y = 1.0;
          *major_radius = dVar5;
          *minor_radius = dVar4;
        }
        center->x = dVar2 * Y[1] + dVar3 * P[1];
        center->y = dVar2 * X[0] + dVar3 * Y[1];
        conic_local._7_1_ = true;
      }
      else {
        conic_local._7_1_ = false;
      }
    }
    else {
      conic_local._7_1_ = false;
    }
  }
  else {
    conic_local._7_1_ = false;
  }
  return conic_local._7_1_;
}

Assistant:

bool ON_IsConicEquationAnEllipse( 
        const double conic[6], 
        ON_2dPoint& center, 
        ON_2dVector& major_axis, 
        ON_2dVector& minor_axis, 
        double* major_radius, 
        double* minor_radius
        )
{
  double A, C, D, E, F, x0, y0;
  double X[2], Y[2], P[2];

  if (    !ON_IsValid(conic[0]) 
       || !ON_IsValid(conic[1]) 
       || !ON_IsValid(conic[2]) 
       || !ON_IsValid(conic[3]) 
       || !ON_IsValid(conic[4]) 
       || !ON_IsValid(conic[5]) 
     )
  {
    return false;
  }

  if ( fabs(conic[1]) > 1.0e-14*fabs(conic[0]+fabs(conic[2])) ) 
  {
    // "B" is non zero - remove "rotation" from conic equation
    const double alpha = 0.5*atan2(conic[1],conic[0]-conic[2]);
    const double s = sin(alpha);
    const double c = cos(alpha);
    X[0] =  c; X[1] = s;
    Y[0] = -s; Y[1] = c;

    A = conic[0]*c*c + conic[1]*c*s + conic[2]*s*s;
    // B = conic[1]*(c*c-s*s) + 2.0*(conic[2]-conic[0])*s*c; // (B = 0)
    C = conic[0]*s*s - conic[1]*c*s + conic[2]*c*c;
    D = conic[3]*c + conic[4]*s;
    E = conic[4]*c - conic[3]*s;
    // F = conic[5]; // F not changed by rotation
  }
  else
  {
    A = conic[0];
    // B = conic[1];
    C = conic[2];
    D = conic[3];
    E = conic[4];
    // F = conic[5]; 
    X[0] = 1.0; X[1] = 0.0;
    Y[0] = 0.0; Y[1] = 1.0;
  }

  F = conic[5];

  // the if (!(...)) insures we exit if A or C is a NaN
  if ( !((A > 0.0 && C > 0.0) || (A < 0.0 && C < 0.0)) )
    return false; // conic is not an ellipse 

  // set P = center
  x0 = -0.5*D/A;
  y0 = -0.5*E/C;
  P[0] = x0*X[0] + y0*Y[0];
  P[1] = x0*X[1] + y0*Y[1];

  // set A and C to ellipse axes lengths
  F = conic[5] -(A*x0*x0 + C*y0*y0);
  if ( !(0.0 != F) )
    return false; // F is 0.0 or a NaN

  // We know A and C have the same sign and F has the opposite sign.
  A = sqrt(-F/A);
  C = sqrt(-F/C);

  if ( A == C )
  {
    // circle
    major_axis.x = 1.0;
    major_axis.y = 0.0;
    minor_axis.x = 0.0;
    minor_axis.y = 1.0;
    *major_radius = A;
    *minor_radius = C;
  }
  else if ( A > C )
  {
    // X = major axis, Y = minor axis
    major_axis.x = X[0];
    major_axis.y = X[1];
    minor_axis.x = Y[0];
    minor_axis.y = Y[1];
    *major_radius = A;
    *minor_radius = C;
  }
  else if ( C > A )
  {
    // Y = major axis, -X = minor axis
    major_axis.x = Y[0];
    major_axis.y = Y[1];
    minor_axis.x = -X[0];
    minor_axis.y = -X[1];
    *major_radius = C;
    *minor_radius = A;
  }
  else
  {
    // A or C is a NaN
    return false;
  }

  center.x = P[0];
  center.y = P[1];

  return true;
}